

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O0

void __thiscall
irr::scene::CMeshSceneNode::CMeshSceneNode
          (CMeshSceneNode *this,IMesh *mesh,ISceneNode *parent,ISceneManager *mgr,s32 id,
          vector3df *position,vector3df *rotation,vector3df *scale)

{
  undefined8 in_RCX;
  s32 id_00;
  ISceneManager *in_RDX;
  ISceneNode *in_RSI;
  void **in_RDI;
  undefined4 in_R8D;
  SMaterial *in_R9;
  IMeshSceneNode *unaff_retaddr;
  array<irr::video::SMaterial> *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffd8;
  void **vtt;
  
  id_00 = (s32)((ulong)in_RCX >> 0x20);
  vtt = in_RDI;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 0x3c));
  IMeshSceneNode::IMeshSceneNode
            (unaff_retaddr,vtt,in_RSI,in_RDX,id_00,
             (vector3df *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),(vector3df *)in_stack_00000010,
             position);
  *in_RDI = vtable + 0x18;
  in_RDI[0x3c] = vtable + 0x170;
  core::array<irr::video::SMaterial>::array(in_stack_00000010);
  core::aabbox3d<float>::aabbox3d((aabbox3d<float> *)in_stack_00000010);
  video::SMaterial::SMaterial(in_R9);
  in_RDI[0x3a] = (void *)0x0;
  *(undefined4 *)(in_RDI + 0x3b) = 0;
  *(undefined1 *)((long)in_RDI + 0x1dc) = 0;
  (**(code **)((long)*in_RDI + 0x120))(in_RDI,in_RSI);
  return;
}

Assistant:

CMeshSceneNode::CMeshSceneNode(IMesh *mesh, ISceneNode *parent, ISceneManager *mgr, s32 id,
		const core::vector3df &position, const core::vector3df &rotation,
		const core::vector3df &scale) :
		IMeshSceneNode(parent, mgr, id, position, rotation, scale),
		Mesh(0),
		PassCount(0), ReadOnlyMaterials(false)
{
#ifdef _DEBUG
	setDebugName("CMeshSceneNode");
#endif

	setMesh(mesh);
}